

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O1

NULLCArray NULLCTypeInfo::TypeName(int *type)

{
  size_t sVar1;
  char *pcVar2;
  NULLCArray NVar3;
  
  if (linker == 0) {
    __assert_fail("linker",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                  ,0xbb,"NULLCArray NULLCTypeInfo::TypeName(int *)");
  }
  if (*(int *)(linker + 0x29c) == 0) {
    pcVar2 = 
    "T &FastVector<char>::operator[](unsigned int) [T = char, zeroNewMemory = false, skipConstructor = false]"
    ;
  }
  else {
    if ((uint)*type < *(uint *)(linker + 0x20c)) {
      pcVar2 = (char *)((ulong)*(uint *)(*(long *)(linker + 0x200) + (ulong)(uint)*type * 0x50) +
                       *(long *)(linker + 0x290));
      sVar1 = strlen(pcVar2);
      NVar3.len = (int)sVar1 + 1;
      NVar3.ptr = pcVar2;
      return NVar3;
    }
    pcVar2 = 
    "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
    ;
  }
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/../Array.h"
                ,0x7f,pcVar2);
}

Assistant:

NULLCArray TypeName(int* type)
	{
		assert(linker);
		NULLCArray ret;
		FastVector<ExternTypeInfo> &exTypes = linker->exTypes;
		char *symbols = &linker->exSymbols[0];

		ret.ptr = exTypes[*type].offsetToName + symbols;
		ret.len = (unsigned int)strlen(ret.ptr) + 1;
		return ret;
	}